

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

uint objgetp(mcmcxdef *mctx,objnum objn,prpnum prop,dattyp *typptr)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uint *in_RCX;
  ushort in_DX;
  long in_RDI;
  bool bVar4;
  int cur;
  int first;
  int last;
  uchar *indbase;
  uchar *indp;
  uchar pbuf [2];
  uint ignprop;
  uint retval;
  int cnt;
  prpdef *p;
  objdef *objptr;
  uchar *in_stack_ffffffffffffff68;
  mcmcxdef *in_stack_ffffffffffffff70;
  mcmcxdef *in_stack_ffffffffffffff78;
  uint local_80;
  int local_6c;
  int local_68;
  int local_54;
  int local_50;
  int local_4c;
  byte *local_40;
  byte local_36;
  byte local_35;
  uint local_34;
  uint local_30;
  uint local_2c;
  byte *local_28;
  uchar *local_20;
  uint *local_18;
  long local_8;
  
  local_18 = in_RCX;
  local_8 = in_RDI;
  oswp2(&local_36,(uint)in_DX);
  local_20 = mcmlck(in_stack_ffffffffffffff78,(mcmon)((ulong)in_stack_ffffffffffffff70 >> 0x30));
  local_34 = 0;
  local_2c = osrp2(local_20 + 6);
  local_2c = local_2c & 0xffff;
  local_30 = 0;
  uVar2 = osrp2(local_20 + 2);
  puVar1 = local_20;
  if ((uVar2 & 2) == 0) {
    uVar2 = osrp2(local_20 + 4);
    local_28 = puVar1 + (long)(int)((uVar2 & 0xffff) << 1) + 0xe;
    for (; local_2c != 0; local_2c = local_2c - 1) {
      if ((*local_28 == local_36) && (local_28[1] == local_35)) {
        if ((local_28[5] & 2) == 0) {
          if (((local_28[5] & 4) == 0) || ((*(uint *)(local_8 + 8) & 1) != 0)) {
            if (local_28 == (byte *)0x0) {
              local_30 = 0;
            }
            else {
              local_30 = (int)local_28 - (int)local_20;
            }
            break;
          }
        }
        else {
          if (local_28 == (byte *)0x0) {
            local_80 = 0;
          }
          else {
            local_80 = (int)local_28 - (int)local_20;
          }
          local_34 = local_80;
        }
      }
      in_stack_ffffffffffffff70 = (mcmcxdef *)(local_28 + 6);
      iVar3 = osrp2(local_28 + 3);
      local_28 = (byte *)((long)in_stack_ffffffffffffff70->mcmcxmtb + (long)iVar3 + -0x30);
    }
  }
  else {
    uVar2 = osrp2(local_20 + 8);
    local_50 = 0;
    local_4c = local_2c - 1;
    while (local_50 <= local_4c) {
      local_54 = local_50 + (local_4c - local_50) / 2;
      local_40 = puVar1 + (long)(local_54 * 4) + (long)(int)(uVar2 & 0xffff);
      if ((*local_40 == local_36) && (local_40[1] == local_35)) {
        local_30 = osrp2(local_40 + 2);
        break;
      }
      if ((*local_40 < local_36) || ((*local_40 == local_36 && (local_40[1] < local_35)))) {
        local_68 = local_54;
        if (local_54 == local_50) {
          local_68 = local_50 + 1;
        }
        local_50 = local_68;
      }
      else {
        local_6c = local_54;
        if (local_54 == local_4c) {
          local_6c = local_4c + -1;
        }
        local_4c = local_6c;
      }
    }
    while( true ) {
      bVar4 = false;
      if (((local_30 != 0) &&
          ((((local_20[(ulong)local_30 + 5] & 2) != 0 ||
            ((bVar4 = false, (local_20[(ulong)local_30 + 5] & 4) != 0 &&
             (bVar4 = false, (*(uint *)(local_8 + 8) & 1) == 0)))) &&
           (bVar4 = false, local_54 < (int)local_2c)))) && (bVar4 = false, *local_40 == local_40[4])
         ) {
        bVar4 = local_40[1] == local_40[5];
      }
      if (!bVar4) break;
      local_30 = osrp2(local_40 + 6);
      local_40 = local_40 + 4;
    }
    if (local_30 != 0) {
      osrp2(local_20 + local_30);
    }
  }
  if (local_30 == 0) {
    local_30 = local_34;
  }
  if ((local_30 != 0) && (local_18 != (uint *)0x0)) {
    if (local_30 == 0) {
      in_stack_ffffffffffffff68 = (uchar *)0x0;
    }
    else {
      in_stack_ffffffffffffff68 = local_20 + local_30;
    }
    *local_18 = (uint)in_stack_ffffffffffffff68[2];
  }
  mcmunlck(in_stack_ffffffffffffff70,(mcmon)((ulong)in_stack_ffffffffffffff68 >> 0x30));
  return local_30;
}

Assistant:

uint objgetp(mcmcxdef *mctx, objnum objn, prpnum prop, dattyp *typptr)
{
    objdef *objptr;
    prpdef *p;
    int     cnt;
    uint    retval;                       /* property offset, if we find it */
    uint    ignprop; /* ignored property - use if real property isn't found */
    uchar   pbuf[2];                  /* property number in portable format */
    uchar  *indp;
    uchar  *indbase;
    int     last;
    int     first;
    int     cur;
    
    oswp2(pbuf, prop);            /* get property number in portable foramt */
    objptr = (objdef *)mcmlck(mctx, objn);      /* get a lock on the object */
    ignprop = 0;                   /* assume we won't find ignored property */
    cnt = objnprop(objptr);             /* get number of properties defined */
    retval = 0;                                          /* presume failure */
    
    if (objflg(objptr) & OBJFINDEX)
    {
        /* there's an index -> do a binary search through the index */
        indbase = (uchar *)objpfre(objptr);                   /* find index */
        first = 0;
        last = cnt - 1;
        for (;;)
        {
            if (first > last) break;           /* crossed over -> not found */
            cur = first + (last - first)/2;         /* split the difference */
            indp = indbase + cur*4;            /* get pointer to this entry */
            if (indp[0] == pbuf[0] && indp[1] == pbuf[1])
            {
                retval = osrp2(indp + 2);
                break;
            }
            else if (indp[0] < pbuf[0]
                     || (indp[0] == pbuf[0] && indp[1] < pbuf[1]))
                first = (cur == first ? first + 1 : cur);
            else
                last = (cur == last ? last - 1 : cur);
        }

        /* ignore ignored and deleted properties if possible */
        while (retval
               && ((prpflg(objptr + retval) & PRPFIGN) != 0
                   || ((prpflg(objptr + retval) & PRPFDEL) != 0
                       && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0))
               && cur < cnt && indp[0] == indp[4] && indp[1] == indp[5])
        {
            indp += 4;
            retval = osrp2(indp + 2);
        }
        if (retval && osrp2(objptr + retval) != prop)
            assert(FALSE);
    }
    else
    {
        /* there's no index -> do sequential search through properties */
        for (p = objprp(objptr) ; cnt ; p = objpnxt(p), --cnt)
        {
            /* if this is the property, and it's not being ignored, use it */
            if (*(uchar *)p == pbuf[0] && *(((uchar *)p) + 1) == pbuf[1])
            {
                if (prpflg(p) & PRPFIGN)                 /* this is ignored */
                    ignprop = objpofs(objptr, p);  /* ... make a note of it */
                else if ((prpflg(p) & PRPFDEL) != 0         /* it's deleted */
                         && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0)
                    /* simply skip it */ ;
                else
                {
                    retval = objpofs(objptr, p);         /* this is the one */
                    break;                                    /* we're done */
                }
            }
        }
    }

    if (!retval) retval = ignprop;     /* use ignored value if nothing else */
    if (retval && typptr) *typptr = prptype(objofsp(objptr, retval));
    
    mcmunlck(mctx, objn);                 /* done with object, so unlock it */
    return(retval);
}